

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5FilterMethod(sqlite3_vtab_cursor *pCursor,int idxNum,char *zUnused,int nVal,
                    sqlite3_value **apVal)

{
  Fts5FullTable *pTab_00;
  Fts5Config *pConfig_00;
  char **ppcVar1;
  Fts5Storage *p;
  int eStmt;
  sqlite3_vtab *psVar2;
  char *pcVar3;
  uint bDesc_00;
  undefined4 uVar4;
  bool bVar5;
  char **pzErr;
  char *zExpr;
  char **pzErrmsg;
  sqlite3_value *psStack_80;
  int iCol;
  sqlite3_value *pRowidGe;
  sqlite3_value *pRowidLe;
  sqlite3_value *pRowidEq;
  sqlite3_value *pRank;
  sqlite3_value *pMatch;
  int bOrderByRank;
  int bDesc;
  int iVal;
  int rc;
  Fts5Cursor *pCsr;
  Fts5Config *pConfig;
  Fts5FullTable *pTab;
  sqlite3_value **apVal_local;
  int nVal_local;
  char *zUnused_local;
  int idxNum_local;
  sqlite3_vtab_cursor *pCursor_local;
  
  pTab_00 = (Fts5FullTable *)pCursor->pVtab;
  pConfig_00 = (pTab_00->p).pConfig;
  pRank = (sqlite3_value *)0x0;
  pRowidEq = (sqlite3_value *)0x0;
  pRowidLe = (sqlite3_value *)0x0;
  pRowidGe = (sqlite3_value *)0x0;
  psStack_80 = (sqlite3_value *)0x0;
  ppcVar1 = pConfig_00->pzErrmsg;
  if (*(int *)&pCursor[4].pVtab != 0) {
    fts5FreeCursorComponents((Fts5Cursor *)pCursor);
    memset(pCursor + 4,0,0x98);
  }
  pConfig_00->pzErrmsg = &(pTab_00->p).base.zErrMsg;
  bVar5 = (idxNum & 1U) != 0;
  if (bVar5) {
    pRank = *apVal;
  }
  bOrderByRank = (int)bVar5;
  if ((idxNum & 2U) != 0) {
    pRowidEq = apVal[bOrderByRank];
    bOrderByRank = bOrderByRank + 1;
  }
  if ((idxNum & 4U) != 0) {
    pRowidLe = apVal[bOrderByRank];
    bOrderByRank = bOrderByRank + 1;
  }
  if ((idxNum & 8U) != 0) {
    pRowidGe = apVal[bOrderByRank];
    bOrderByRank = bOrderByRank + 1;
  }
  if ((idxNum & 0x10U) != 0) {
    psStack_80 = apVal[bOrderByRank];
  }
  bDesc_00 = (uint)((idxNum & 0x80U) != 0);
  *(uint *)((long)&pCursor[4].pVtab + 4) = bDesc_00;
  if (pRowidLe != (sqlite3_value *)0x0) {
    psStack_80 = pRowidLe;
    pRowidGe = pRowidLe;
  }
  if (bDesc_00 == 0) {
    psVar2 = (sqlite3_vtab *)fts5GetRowidLimit(pRowidGe,0x7fffffffffffffff);
    pCursor[6].pVtab = psVar2;
    psVar2 = (sqlite3_vtab *)fts5GetRowidLimit(psStack_80,-0x8000000000000000);
    pCursor[5].pVtab = psVar2;
  }
  else {
    psVar2 = (sqlite3_vtab *)fts5GetRowidLimit(pRowidGe,0x7fffffffffffffff);
    pCursor[5].pVtab = psVar2;
    psVar2 = (sqlite3_vtab *)fts5GetRowidLimit(psStack_80,-0x8000000000000000);
    pCursor[6].pVtab = psVar2;
  }
  if (pTab_00->pSortCsr == (Fts5Cursor *)0x0) {
    if (pRank == (sqlite3_value *)0x0) {
      if (pConfig_00->zContent == (char *)0x0) {
        pcVar3 = sqlite3_mprintf("%s: table does not support scanning",pConfig_00->zName);
        *pConfig_00->pzErrmsg = pcVar3;
        bDesc = 1;
      }
      else {
        uVar4 = 5;
        if (pRowidLe != (sqlite3_value *)0x0) {
          uVar4 = 6;
        }
        *(undefined4 *)&pCursor[4].pVtab = uVar4;
        p = pTab_00->pStorage;
        eStmt = fts5StmtType((Fts5Cursor *)pCursor);
        bDesc = sqlite3Fts5StorageStmt
                          (p,eStmt,(sqlite3_stmt **)(pCursor + 7),&(pTab_00->p).base.zErrMsg);
        if (bDesc == 0) {
          if (*(int *)&pCursor[4].pVtab == 6) {
            sqlite3_bind_value((sqlite3_stmt *)pCursor[7].pVtab,1,*apVal);
          }
          else {
            sqlite3_bind_int64((sqlite3_stmt *)pCursor[7].pVtab,1,(sqlite_int64)pCursor[5].pVtab);
            sqlite3_bind_int64((sqlite3_stmt *)pCursor[7].pVtab,2,(sqlite_int64)pCursor[6].pVtab);
          }
          bDesc = fts5NextMethod(pCursor);
        }
      }
    }
    else {
      pzErr = (char **)sqlite3_value_text(*apVal);
      if (pzErr == (char **)0x0) {
        pzErr = (char **)0x2903fe;
      }
      bDesc = fts5CursorParseRank(pConfig_00,(Fts5Cursor *)pCursor,pRowidEq);
      if (bDesc == 0) {
        if (*(char *)pzErr == '*') {
          bDesc = fts5SpecialMatch(pTab_00,(Fts5Cursor *)pCursor,(char *)((long)pzErr + 1));
        }
        else {
          bDesc = sqlite3Fts5ExprNew(pConfig_00,idxNum >> 0x10,(char *)pzErr,
                                     (Fts5Expr **)(pCursor + 8),&(pTab_00->p).base.zErrMsg);
          if (bDesc == 0) {
            if ((idxNum & 0x20U) == 0) {
              *(undefined4 *)&pCursor[4].pVtab = 1;
              bDesc = fts5CursorFirst(pTab_00,(Fts5Cursor *)pCursor,bDesc_00);
            }
            else {
              *(undefined4 *)&pCursor[4].pVtab = 4;
              bDesc = fts5CursorFirstSorted(pTab_00,(Fts5Cursor *)pCursor,bDesc_00);
            }
          }
        }
      }
    }
  }
  else {
    if (pTab_00->pSortCsr->bDesc == 0) {
      pCursor[6].pVtab = (sqlite3_vtab *)pTab_00->pSortCsr->iLastRowid;
      pCursor[5].pVtab = (sqlite3_vtab *)pTab_00->pSortCsr->iFirstRowid;
    }
    else {
      pCursor[6].pVtab = (sqlite3_vtab *)pTab_00->pSortCsr->iFirstRowid;
      pCursor[5].pVtab = (sqlite3_vtab *)pTab_00->pSortCsr->iLastRowid;
    }
    *(undefined4 *)&pCursor[4].pVtab = 2;
    pCursor[8].pVtab = (sqlite3_vtab *)pTab_00->pSortCsr->pExpr;
    bDesc = fts5CursorFirst(pTab_00,(Fts5Cursor *)pCursor,bDesc_00);
  }
  pConfig_00->pzErrmsg = ppcVar1;
  return bDesc;
}

Assistant:

static int fts5FilterMethod(
  sqlite3_vtab_cursor *pCursor,   /* The cursor used for this query */
  int idxNum,                     /* Strategy index */
  const char *zUnused,            /* Unused */
  int nVal,                       /* Number of elements in apVal */
  sqlite3_value **apVal           /* Arguments for the indexing scheme */
){
  Fts5FullTable *pTab = (Fts5FullTable*)(pCursor->pVtab);
  Fts5Config *pConfig = pTab->p.pConfig;
  Fts5Cursor *pCsr = (Fts5Cursor*)pCursor;
  int rc = SQLITE_OK;             /* Error code */
  int iVal = 0;                   /* Counter for apVal[] */
  int bDesc;                      /* True if ORDER BY [rank|rowid] DESC */
  int bOrderByRank;               /* True if ORDER BY rank */
  sqlite3_value *pMatch = 0;      /* <tbl> MATCH ? expression (or NULL) */
  sqlite3_value *pRank = 0;       /* rank MATCH ? expression (or NULL) */
  sqlite3_value *pRowidEq = 0;    /* rowid = ? expression (or NULL) */
  sqlite3_value *pRowidLe = 0;    /* rowid <= ? expression (or NULL) */
  sqlite3_value *pRowidGe = 0;    /* rowid >= ? expression (or NULL) */
  int iCol;                       /* Column on LHS of MATCH operator */
  char **pzErrmsg = pConfig->pzErrmsg;

  UNUSED_PARAM(zUnused);
  UNUSED_PARAM(nVal);

  if( pCsr->ePlan ){
    fts5FreeCursorComponents(pCsr);
    memset(&pCsr->ePlan, 0, sizeof(Fts5Cursor) - ((u8*)&pCsr->ePlan-(u8*)pCsr));
  }

  assert( pCsr->pStmt==0 );
  assert( pCsr->pExpr==0 );
  assert( pCsr->csrflags==0 );
  assert( pCsr->pRank==0 );
  assert( pCsr->zRank==0 );
  assert( pCsr->zRankArgs==0 );

  assert( pzErrmsg==0 || pzErrmsg==&pTab->p.base.zErrMsg );
  pConfig->pzErrmsg = &pTab->p.base.zErrMsg;

  /* Decode the arguments passed through to this function.
  **
  ** Note: The following set of if(...) statements must be in the same
  ** order as the corresponding entries in the struct at the top of
  ** fts5BestIndexMethod().  */
  if( BitFlagTest(idxNum, FTS5_BI_MATCH) ) pMatch = apVal[iVal++];
  if( BitFlagTest(idxNum, FTS5_BI_RANK) ) pRank = apVal[iVal++];
  if( BitFlagTest(idxNum, FTS5_BI_ROWID_EQ) ) pRowidEq = apVal[iVal++];
  if( BitFlagTest(idxNum, FTS5_BI_ROWID_LE) ) pRowidLe = apVal[iVal++];
  if( BitFlagTest(idxNum, FTS5_BI_ROWID_GE) ) pRowidGe = apVal[iVal++];
  iCol = (idxNum>>16);
  assert( iCol>=0 && iCol<=pConfig->nCol );
  assert( iVal==nVal );
  bOrderByRank = ((idxNum & FTS5_BI_ORDER_RANK) ? 1 : 0);
  pCsr->bDesc = bDesc = ((idxNum & FTS5_BI_ORDER_DESC) ? 1 : 0);

  /* Set the cursor upper and lower rowid limits. Only some strategies 
  ** actually use them. This is ok, as the xBestIndex() method leaves the
  ** sqlite3_index_constraint.omit flag clear for range constraints
  ** on the rowid field.  */
  if( pRowidEq ){
    pRowidLe = pRowidGe = pRowidEq;
  }
  if( bDesc ){
    pCsr->iFirstRowid = fts5GetRowidLimit(pRowidLe, LARGEST_INT64);
    pCsr->iLastRowid = fts5GetRowidLimit(pRowidGe, SMALLEST_INT64);
  }else{
    pCsr->iLastRowid = fts5GetRowidLimit(pRowidLe, LARGEST_INT64);
    pCsr->iFirstRowid = fts5GetRowidLimit(pRowidGe, SMALLEST_INT64);
  }

  if( pTab->pSortCsr ){
    /* If pSortCsr is non-NULL, then this call is being made as part of 
    ** processing for a "... MATCH <expr> ORDER BY rank" query (ePlan is
    ** set to FTS5_PLAN_SORTED_MATCH). pSortCsr is the cursor that will
    ** return results to the user for this query. The current cursor 
    ** (pCursor) is used to execute the query issued by function 
    ** fts5CursorFirstSorted() above.  */
    assert( pRowidEq==0 && pRowidLe==0 && pRowidGe==0 && pRank==0 );
    assert( nVal==0 && pMatch==0 && bOrderByRank==0 && bDesc==0 );
    assert( pCsr->iLastRowid==LARGEST_INT64 );
    assert( pCsr->iFirstRowid==SMALLEST_INT64 );
    if( pTab->pSortCsr->bDesc ){
      pCsr->iLastRowid = pTab->pSortCsr->iFirstRowid;
      pCsr->iFirstRowid = pTab->pSortCsr->iLastRowid;
    }else{
      pCsr->iLastRowid = pTab->pSortCsr->iLastRowid;
      pCsr->iFirstRowid = pTab->pSortCsr->iFirstRowid;
    }
    pCsr->ePlan = FTS5_PLAN_SOURCE;
    pCsr->pExpr = pTab->pSortCsr->pExpr;
    rc = fts5CursorFirst(pTab, pCsr, bDesc);
  }else if( pMatch ){
    const char *zExpr = (const char*)sqlite3_value_text(apVal[0]);
    if( zExpr==0 ) zExpr = "";

    rc = fts5CursorParseRank(pConfig, pCsr, pRank);
    if( rc==SQLITE_OK ){
      if( zExpr[0]=='*' ){
        /* The user has issued a query of the form "MATCH '*...'". This
        ** indicates that the MATCH expression is not a full text query,
        ** but a request for an internal parameter.  */
        rc = fts5SpecialMatch(pTab, pCsr, &zExpr[1]);
      }else{
        char **pzErr = &pTab->p.base.zErrMsg;
        rc = sqlite3Fts5ExprNew(pConfig, iCol, zExpr, &pCsr->pExpr, pzErr);
        if( rc==SQLITE_OK ){
          if( bOrderByRank ){
            pCsr->ePlan = FTS5_PLAN_SORTED_MATCH;
            rc = fts5CursorFirstSorted(pTab, pCsr, bDesc);
          }else{
            pCsr->ePlan = FTS5_PLAN_MATCH;
            rc = fts5CursorFirst(pTab, pCsr, bDesc);
          }
        }
      }
    }
  }else if( pConfig->zContent==0 ){
    *pConfig->pzErrmsg = sqlite3_mprintf(
        "%s: table does not support scanning", pConfig->zName
    );
    rc = SQLITE_ERROR;
  }else{
    /* This is either a full-table scan (ePlan==FTS5_PLAN_SCAN) or a lookup
    ** by rowid (ePlan==FTS5_PLAN_ROWID).  */
    pCsr->ePlan = (pRowidEq ? FTS5_PLAN_ROWID : FTS5_PLAN_SCAN);
    rc = sqlite3Fts5StorageStmt(
        pTab->pStorage, fts5StmtType(pCsr), &pCsr->pStmt, &pTab->p.base.zErrMsg
    );
    if( rc==SQLITE_OK ){
      if( pCsr->ePlan==FTS5_PLAN_ROWID ){
        sqlite3_bind_value(pCsr->pStmt, 1, apVal[0]);
      }else{
        sqlite3_bind_int64(pCsr->pStmt, 1, pCsr->iFirstRowid);
        sqlite3_bind_int64(pCsr->pStmt, 2, pCsr->iLastRowid);
      }
      rc = fts5NextMethod(pCursor);
    }
  }

  pConfig->pzErrmsg = pzErrmsg;
  return rc;
}